

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

bool __thiscall cmCTest::SetTest(cmCTest *this,char *ttype,bool report)

{
  undefined1 auVar1 [16];
  int iVar2;
  Part PVar3;
  size_t sVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ostringstream cmCTestLog_msg;
  undefined1 auStack_1c8 [7];
  allocator local_1c1;
  string local_1c0;
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  long lVar7;
  
  std::__cxx11::string::string((string *)&local_1c0,ttype,&local_1c1);
  cmsys::SystemTools::LowerCase((string *)local_1a0,&local_1c0);
  iVar2 = std::__cxx11::string::compare(local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,local_1a0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  auVar1 = _DAT_00583fa0;
  if (iVar2 == 0) {
    lVar5 = 0;
    auVar6 = _DAT_00583f80;
    auVar8 = _DAT_00583f90;
    do {
      auVar9 = auVar8 ^ auVar1;
      if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffff5) {
        (&this->Parts[0].Enabled)[lVar5] = true;
        (&this->Parts[1].Enabled)[lVar5] = true;
      }
      auVar9 = auVar6 ^ auVar1;
      if (auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffff5) {
        (&this->Parts[2].Enabled)[lVar5] = true;
        (&this->Parts[3].Enabled)[lVar5] = true;
      }
      lVar7 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar7 + 4;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 4;
      auVar6._8_8_ = lVar7 + 4;
      lVar5 = lVar5 + 0x100;
    } while (lVar5 != 0x300);
  }
  else {
    PVar3 = GetPartFromName(this,ttype);
    if (PVar3 == PartCount) {
      if (report) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0,"Don\'t know about test \"",0x17);
        if (ttype == (char *)0x0) {
          std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0._0_8_ + -0x18) + 0x28);
        }
        else {
          sVar4 = strlen(ttype);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,ttype,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\" yet...",8);
        std::ios::widen((char)(ostream *)local_1a0 + (char)*(undefined8 *)(local_1a0._0_8_ + -0x18))
        ;
        std::ostream::put((char)local_1a0);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(this,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmCTest.cxx"
            ,0x368,local_1c0._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
        std::ios_base::~ios_base(local_130);
      }
      return false;
    }
    this->Parts[PVar3].Enabled = true;
  }
  return true;
}

Assistant:

bool cmCTest::SetTest(const char* ttype, bool report)
{
  if ( cmSystemTools::LowerCase(ttype) == "all" )
    {
    for(Part p = PartStart; p != PartCount; p = Part(p+1))
      {
      this->Parts[p].Enable();
      }
    return true;
    }
  Part p = this->GetPartFromName(ttype);
  if(p != PartCount)
    {
    this->Parts[p].Enable();
    return true;
    }
  else
    {
    if ( report )
      {
      cmCTestLog(this, ERROR_MESSAGE, "Don't know about test \"" << ttype
        << "\" yet..." << std::endl);
      }
    return false;
    }
}